

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O0

_Bool borg_offset_projectable(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  _Bool _Var1;
  borg_grid *ag_00;
  borg_grid *ag;
  wchar_t x;
  wchar_t y;
  wchar_t dist;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  
  x = L'\0';
  ag._0_4_ = x1;
  ag._4_4_ = y1;
  y = x2;
  dist = y2;
  x2_local = x1;
  y2_local = y1;
  while( true ) {
    if ((((int)(uint)z_info->max_range < x) ||
        (((ag_00 = borg_grids[ag._4_4_] + (wchar_t)ag, x != L'\0' && (ag_00->feat == '\0')) ||
         (ag_00->feat == '\x18')))) ||
       ((x != L'\0' && (_Var1 = borg_cave_floor_grid(ag_00), !_Var1)))) {
      return false;
    }
    if (((wchar_t)ag == y) && (ag._4_4_ == dist)) break;
    borg_inc_motion((int *)((long)&ag + 4),(int *)&ag,y2_local,x2_local,dist,y);
    x = x + L'\x01';
  }
  return true;
}

Assistant:

bool borg_offset_projectable(int y1, int x1, int y2, int x2)
{
    int dist, y, x;

    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Assume all unknown grids are walls. */
        if ((dist) && (ag->feat == FEAT_NONE))
            break;

        /* Never pass through rubble */
        if (ag->feat == FEAT_PASS_RUBBLE)
            break;

        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2))
            return true;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}